

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O0

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadAnimation2Node(XMLLoader *this,Ref<embree::XML> *xml)

{
  size_t sVar1;
  runtime_error *this_00;
  long *in_RDX;
  Node *in_RDI;
  Ref<embree::SceneGraph::Node> node1;
  Ref<embree::SceneGraph::Node> *node0;
  Ref<embree::SceneGraph::Node> *in_stack_000001d8;
  Ref<embree::SceneGraph::Node> *in_stack_00000470;
  Ref<embree::SceneGraph::Node> *in_stack_00000478;
  Ref<embree::XML> *in_stack_00001738;
  XMLLoader *in_stack_00001740;
  char *in_stack_fffffffffffffe40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe48;
  _func_int **local_128;
  long *local_120;
  ParseLocation *in_stack_fffffffffffffee8;
  _func_int **pp_Var2;
  long *local_110;
  byte local_106;
  undefined1 local_105;
  string local_d8 [32];
  long *local_b8;
  long *local_a0;
  long *local_98;
  long *local_90;
  undefined1 *local_78;
  long **local_70;
  long **local_68;
  _func_int ***local_58;
  long **local_50;
  undefined1 *local_40;
  _func_int ***local_30;
  long **local_20;
  
  local_b8 = in_RDX;
  sVar1 = XML::size((XML *)0x3cc6b2);
  if (sVar1 == 2) {
    local_106 = 0;
    local_98 = local_b8;
    std::vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>::operator[]
              ((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_> *)
               (*local_b8 + 0x80),0);
    loadNode(in_stack_00001740,in_stack_00001738);
    local_a0 = local_b8;
    std::vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>::operator[]
              ((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_> *)
               (*local_b8 + 0x80),1);
    loadNode(in_stack_00001740,in_stack_00001738);
    local_78 = &stack0xfffffffffffffee8;
    pp_Var2 = (in_RDI->super_RefCount)._vptr_RefCount;
    if (pp_Var2 != (_func_int **)0x0) {
      (**(code **)(*pp_Var2 + 0x10))();
    }
    local_68 = &local_120;
    local_70 = &local_110;
    local_120 = local_110;
    if (local_110 != (long *)0x0) {
      (**(code **)(*local_110 + 0x10))();
    }
    SceneGraph::extend_animation(in_stack_00000478,in_stack_00000470);
    local_50 = &local_120;
    if (local_120 != (long *)0x0) {
      (**(code **)(*local_120 + 0x18))();
    }
    local_40 = &stack0xfffffffffffffee8;
    if (pp_Var2 != (_func_int **)0x0) {
      (**(code **)(*pp_Var2 + 0x18))();
    }
    local_58 = &local_128;
    local_128 = (in_RDI->super_RefCount)._vptr_RefCount;
    if (local_128 != (_func_int **)0x0) {
      (**(code **)(*local_128 + 0x10))();
    }
    SceneGraph::optimize_animation(in_stack_000001d8);
    local_30 = &local_128;
    if (local_128 != (_func_int **)0x0) {
      (**(code **)(*local_128 + 0x18))();
    }
    local_106 = 1;
    local_20 = &local_110;
    if (local_110 != (long *)0x0) {
      (**(code **)(*local_110 + 0x18))();
    }
    if (((local_106 & 1) == 0) && ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0)) {
      (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x18))();
    }
    return (Ref<embree::SceneGraph::Node>)in_RDI;
  }
  local_105 = 1;
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_90 = local_b8;
  ParseLocation::str_abi_cxx11_(in_stack_fffffffffffffee8);
  std::operator+(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  std::runtime_error::runtime_error(this_00,local_d8);
  local_105 = 0;
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadAnimation2Node(const Ref<XML>& xml) 
  {
    if (xml->size() != 2) THROW_RUNTIME_ERROR(xml->loc.str()+": invalid Animation2 node");
    Ref<SceneGraph::Node> node0 = loadNode(xml->children[0]);
    Ref<SceneGraph::Node> node1 = loadNode(xml->children[1]);
    SceneGraph::extend_animation(node0,node1);
    SceneGraph::optimize_animation(node0);
    return node0;
  }